

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pembase64.c
# Opt level: O0

void ptls_base64_cell(uint8_t *data,char *text)

{
  int local_2c;
  int local_28;
  int i;
  int n [4];
  char *text_local;
  uint8_t *data_local;
  
  n._8_8_ = text;
  local_28 = (int)(uint)*data >> 2;
  i = (*data & 3) << 4 | (int)(uint)data[1] >> 4;
  n[0] = (data[1] & 0xf) << 2 | (int)(uint)data[2] >> 6;
  n[1] = data[2] & 0x3f;
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    text[local_2c] = ptls_base64_alphabet[(&local_28)[local_2c]];
  }
  return;
}

Assistant:

static void ptls_base64_cell(const uint8_t *data, char *text)
{
    int n[4];

    n[0] = data[0] >> 2;
    n[1] = ((data[0] & 3) << 4) | (data[1] >> 4);
    n[2] = ((data[1] & 15) << 2) | (data[2] >> 6);
    n[3] = data[2] & 63;

    for (int i = 0; i < 4; i++) {
        text[i] = ptls_base64_alphabet[n[i]];
    }
}